

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacReporters.cpp
# Opt level: O0

bool __thiscall
ApprovalTests::Mac::MacDiffReporter::report(MacDiffReporter *this,string *received,string *approved)

{
  bool bVar1;
  string *in_RDX;
  string *in_RSI;
  string *unaff_retaddr;
  FirstWorkingReporter *in_stack_00000008;
  string local_60 [32];
  string local_40 [56];
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar2;
  
  bVar1 = SystemUtils::isMacOs();
  if (bVar1) {
    ::std::__cxx11::string::string(local_40,in_RSI);
    ::std::__cxx11::string::string(local_60,in_RDX);
    bVar2 = FirstWorkingReporter::report
                      (in_stack_00000008,unaff_retaddr,
                       (string *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    ::std::__cxx11::string::~string(local_60);
    ::std::__cxx11::string::~string(local_40);
  }
  else {
    bVar2 = 0;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool MacDiffReporter::report(std::string received, std::string approved) const
        {
            if (!SystemUtils::isMacOs())
            {
                return false;
            }
            return FirstWorkingReporter::report(received, approved);
        }